

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_file_system.cpp
# Opt level: O2

void duckdb::RecursiveGlobDirectories
               (FileSystem *fs,string *path,vector<duckdb::OpenFileInfo,_true> *result,
               bool match_directory,bool join_path)

{
  bool join_path_local;
  bool match_directory_local;
  _Any_data local_38;
  code *local_28;
  code *pcStack_20;
  
  local_28 = (code *)0x0;
  pcStack_20 = (code *)0x0;
  local_38._M_unused._M_object = (void *)0x0;
  local_38._8_8_ = 0;
  join_path_local = join_path;
  match_directory_local = match_directory;
  local_38._M_unused._M_object = operator_new(0x28);
  *(bool **)local_38._M_unused._0_8_ = &join_path_local;
  *(FileSystem **)((long)local_38._M_unused._0_8_ + 8) = fs;
  *(string **)((long)local_38._M_unused._0_8_ + 0x10) = path;
  *(bool **)((long)local_38._M_unused._0_8_ + 0x18) = &match_directory_local;
  *(vector<duckdb::OpenFileInfo,_true> **)((long)local_38._M_unused._0_8_ + 0x20) = result;
  pcStack_20 = std::
               _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/common/local_file_system.cpp:1251:21)>
               ::_M_invoke;
  local_28 = std::
             _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/common/local_file_system.cpp:1251:21)>
             ::_M_manager;
  (*fs->_vptr_FileSystem[0x10])(fs,path,&local_38,0);
  ::std::_Function_base::~_Function_base((_Function_base *)&local_38);
  return;
}

Assistant:

static void RecursiveGlobDirectories(FileSystem &fs, const string &path, vector<OpenFileInfo> &result,
                                     bool match_directory, bool join_path) {

	fs.ListFiles(path, [&](const string &fname, bool is_directory) {
		string concat;
		if (join_path) {
			concat = fs.JoinPath(path, fname);
		} else {
			concat = fname;
		}
		if (IsSymbolicLink(concat)) {
			return;
		}
		if (is_directory == match_directory) {
			result.push_back(concat);
		}
		if (is_directory) {
			RecursiveGlobDirectories(fs, concat, result, match_directory, true);
		}
	});
}